

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IntensityILS.h
# Opt level: O3

double __thiscall imrt::IntensityILS::perturbation(IntensityILS *this,Plan *P)

{
  Station *this_00;
  _List_node_base *p_Var1;
  int iVar2;
  list<imrt::Station_*,_std::allocator<imrt::Station_*>_> *plVar3;
  _List_node_base *p_Var4;
  long lVar5;
  int iVar6;
  double dVar7;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> diff;
  _List_node_base local_40;
  undefined8 local_30;
  
  dVar7 = Plan::getEvaluation(P);
  if (0 < this->perturbation_size) {
    iVar6 = 0;
    do {
      iVar2 = rand();
      plVar3 = Plan::get_stations_abi_cxx11_(P);
      p_Var4 = (P->stations).super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>.
               _M_impl._M_node.super__List_node_base._M_next;
      iVar2 = (int)((ulong)(long)iVar2 %
                   (plVar3->super__List_base<imrt::Station_*,_std::allocator<imrt::Station_*>_>).
                   _M_impl._M_node._M_size);
      lVar5 = (long)iVar2;
      if (iVar2 < 1) {
        if (iVar2 != 0) {
          do {
            p_Var4 = p_Var4->_M_prev;
            lVar5 = lVar5 + 1;
          } while (lVar5 != 0);
        }
      }
      else {
        do {
          p_Var4 = p_Var4->_M_next;
          lVar5 = lVar5 + -1;
        } while (lVar5 != 0);
      }
      this_00 = (Station *)p_Var4[1]._M_next;
      local_30 = 0;
      local_40._M_next = &local_40;
      local_40._M_prev = &local_40;
      Station::reduce_apertures
                (this_00,(list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                         &local_40);
      dVar7 = Plan::incremental_eval
                        (P,this_00,
                         (list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                         &local_40);
      p_Var4 = local_40._M_next;
      while (p_Var4 != &local_40) {
        p_Var1 = (((_List_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                  &p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        operator_delete(p_Var4);
        p_Var4 = p_Var1;
      }
      iVar6 = iVar6 + 1;
    } while (iVar6 < this->perturbation_size);
  }
  this->maxdelta = this->maxdelta0;
  this->maxratio = this->maxratio0;
  return dVar7;
}

Assistant:

virtual double perturbation(Plan& P) {
		double eval=P.getEvaluation();
		for(int i=0; i<perturbation_size; i++){
			int r=rand()%P.get_stations().size();
			Station* s=P.get_station(r);
			list< pair< int, double > > diff;
			s->reduce_apertures(diff);
			eval=P.incremental_eval(*s,diff);
		}
		maxdelta=maxdelta0;
		maxratio=maxratio0;

		return(eval);
	}